

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSite::~IfcSite(IfcSite *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)
   &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x867da8;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x867e98;
  this[-1].super_IfcSpatialStructureElement.CompositionType._M_dataplus._M_p = "fAO";
  this[-1].super_IfcSpatialStructureElement.CompositionType.field_2._M_allocated_capacity = 0x867df8
  ;
  *(undefined8 *)&this[-1].field_0x180 = 0x867e20;
  *(undefined8 *)&this[-1].RefElevation.have = 0x867e48;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x867e70;
  puVar2 = *(undefined1 **)
            &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  pvVar3 = *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
                      field_0x30;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.
                                     super_IfcObject.field_0x40 - (long)pvVar3);
  }
  puVar1 = &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18;
  pvVar3 = *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
                      field_0x10;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.
                                     super_IfcObject.field_0x20 - (long)pvVar3);
  }
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            ((IfcSpatialStructureElement *)puVar1,&PTR_construction_vtable_24__00867eb0);
  operator_delete(puVar1,0x208);
  return;
}

Assistant:

IfcSite() : Object("IfcSite") {}